

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.h
# Opt level: O3

void trieste::detail::register_token(TokenDef *def)

{
  char *pcVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  runtime_error *this;
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (token_map()::global_map == '\0') {
    register_token();
  }
  pcVar1 = def->name;
  local_38._M_dataplus._M_p = (pointer)strlen(pcVar1);
  local_38._M_string_length = (size_type)pcVar1;
  iVar2 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>_>
          ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>_>
                  *)token_map()::global_map,(key_type *)&local_38);
  if (iVar2._M_node == (_Base_ptr)(token_map()::global_map + 8)) {
    pcVar1 = def->name;
    local_38._M_dataplus._M_p = (pointer)strlen(pcVar1);
    local_38._M_string_length = (size_type)pcVar1;
    pmVar3 = std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>_>
             ::operator[]((map<std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>_>
                           *)token_map()::global_map,(key_type *)&local_38);
    pmVar3->def = def;
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,def->name,&local_59);
  std::operator+(&local_38,"Duplicate token definition: ",&local_58);
  std::runtime_error::runtime_error(this,(string *)&local_38);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void register_token(const TokenDef& def)
    {
      auto& map = token_map();
      auto it = map.find(def.name);
      if (it != map.end())
        throw std::runtime_error(
          "Duplicate token definition: " + std::string(def.name));

      Token t = def;
      map[t.str()] = t;
    }